

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool bloaty::MmapInputFile::DoTryOpen
               (string_view filename,
               unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file)

{
  string_view data;
  string_view filename_00;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  int fd_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *this;
  pointer in_RDX;
  char *in_RSI;
  size_t in_RDI;
  char *map;
  stat buf;
  FileDescriptor fd;
  string str;
  Nullable<const_char_*> in_stack_fffffffffffffcc8;
  Arg *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  allocator<char> *paVar5;
  size_t in_stack_fffffffffffffcf8;
  Arg *in_stack_fffffffffffffd00;
  Arg *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  Arg local_2a8;
  string local_268 [80];
  size_t local_218;
  char *pcStack_210;
  Arg local_200;
  string local_1c0 [36];
  undefined4 local_19c;
  size_t local_168;
  char *pcStack_160;
  Arg local_150;
  string local_110 [32];
  char *local_f0;
  stat local_e8;
  FileDescriptor local_58 [5];
  allocator<char> local_41;
  string local_40 [32];
  pointer local_20;
  size_t local_18;
  char *pcStack_10;
  byte local_1;
  
  paVar5 = &local_41;
  local_20 = in_RDX;
  local_18 = in_RDI;
  pcStack_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->piece_,
             (allocator<char> *)in_stack_fffffffffffffd00);
  std::allocator<char>::~allocator(&local_41);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  fd_00 = open(pcVar3,0);
  FileDescriptor::FileDescriptor(local_58,fd_00);
  iVar1 = FileDescriptor::fd(local_58);
  if (iVar1 < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8);
    local_168 = local_18;
    pcStack_160 = pcStack_10;
    value_01._M_str = pcStack_10;
    value_01._M_len = local_18;
    absl::substitute_internal::Arg::Arg(&local_150,value_01);
    piVar4 = __errno_location();
    strerror(*piVar4);
    absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    format._M_str = in_stack_fffffffffffffd18;
    format._M_len = (size_t)in_stack_fffffffffffffd10;
    absl::Substitute_abi_cxx11_(format,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator<<((ostream *)&std::cerr,local_110);
    std::__cxx11::string::~string(local_110);
    local_1 = 0;
  }
  else {
    in_stack_fffffffffffffce4 = FileDescriptor::fd(local_58);
    iVar2 = fstat(in_stack_fffffffffffffce4,&local_e8);
    if (iVar2 < 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 in_stack_fffffffffffffcd8);
      local_218 = local_18;
      pcStack_210 = pcStack_10;
      value_00._M_str = pcStack_10;
      value_00._M_len = local_18;
      absl::substitute_internal::Arg::Arg(&local_200,value_00);
      piVar4 = __errno_location();
      strerror(*piVar4);
      absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      format_00._M_str = in_stack_fffffffffffffd18;
      format_00._M_len = (size_t)in_stack_fffffffffffffd10;
      absl::Substitute_abi_cxx11_(format_00,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator<<((ostream *)&std::cerr,local_1c0);
      std::__cxx11::string::~string(local_1c0);
      local_1 = 0;
    }
    else {
      pcVar3 = (char *)local_e8.st_size;
      in_stack_fffffffffffffce0 = FileDescriptor::fd(local_58);
      local_f0 = (char *)mmap((void *)0x0,(size_t)pcVar3,1,1,in_stack_fffffffffffffce0,0);
      if (local_f0 == (char *)0xffffffffffffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),pcVar3);
        value._M_str = pcStack_10;
        value._M_len = local_18;
        absl::substitute_internal::Arg::Arg(&local_2a8,value);
        piVar4 = __errno_location();
        strerror(*piVar4);
        absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        format_01._M_str = in_stack_fffffffffffffd18;
        format_01._M_len = (size_t)in_stack_fffffffffffffd10;
        absl::Substitute_abi_cxx11_(format_01,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        std::operator<<((ostream *)&std::cerr,local_268);
        std::__cxx11::string::~string(local_268);
        local_1 = 0;
      }
      else {
        this = (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
               operator_new(0x38);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffcf8,
                   local_f0,local_e8.st_size);
        filename_00._M_str = (char *)in_stack_fffffffffffffd00;
        filename_00._M_len = in_stack_fffffffffffffcf8;
        data._M_len._4_4_ = fd_00;
        data._M_len._0_4_ = iVar1;
        data._M_str = (char *)paVar5;
        MmapInputFile((MmapInputFile *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                      ,filename_00,data);
        std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::reset
                  (this,local_20);
        local_1 = 1;
      }
    }
  }
  local_19c = 1;
  FileDescriptor::~FileDescriptor
            ((FileDescriptor *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool MmapInputFile::DoTryOpen(std::string_view filename,
                              std::unique_ptr<InputFile>& file) {
  std::string str(filename);
  FileDescriptor fd(open(str.c_str(), O_RDONLY));
  struct stat buf;
  const char* map;

  if (fd.fd() < 0) {
    std::cerr << absl::Substitute("couldn't open file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  if (fstat(fd.fd(), &buf) < 0) {
    std::cerr << absl::Substitute("couldn't stat file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  map = static_cast<char*>(
      mmap(nullptr, buf.st_size, PROT_READ, MAP_SHARED, fd.fd(), 0));

  if (map == MAP_FAILED) {
    std::cerr << absl::Substitute("couldn't mmap file '$0': $1", filename,
                                  strerror(errno));
    return false;
  }

  file.reset(new MmapInputFile(filename, string_view(map, buf.st_size)));
  return true;
}